

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

Variant * __thiscall Jinx::Impl::Parser::ParseValue(Variant *__return_storage_ptr__,Parser *this)

{
  pointer pSVar1;
  Symbol *pSVar2;
  
  if ((this->m_error == false) &&
     (pSVar1 = (this->m_currentSymbol)._M_current,
     pSVar1 != (this->m_symbolList->
               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl
               .super__Vector_impl_data._M_finish)) {
    __return_storage_ptr__->m_type = Null;
    switch(pSVar1->type) {
    case StringValue:
      Variant::SetString(__return_storage_ptr__,&pSVar1->text);
      break;
    case NumberValue:
      Variant::SetNumber(__return_storage_ptr__,(pSVar1->field_2).numVal);
      break;
    case IntegerValue:
      Variant::SetInteger(__return_storage_ptr__,(pSVar1->field_2).intVal);
      break;
    case BooleanValue:
      Variant::SetBoolean(__return_storage_ptr__,(pSVar1->field_2).boolVal);
      break;
    default:
      if (pSVar1->type != Null) {
        Error<>(this,"Unknown value");
      }
    }
    pSVar2 = (this->m_currentSymbol)._M_current;
    this->m_lastLine = pSVar2->lineNumber;
    (this->m_currentSymbol)._M_current = pSVar2 + 1;
  }
  else {
    __return_storage_ptr__->m_type = Null;
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant Parser::ParseValue()
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return Variant();
		Variant val;
		switch (m_currentSymbol->type)
		{
		case SymbolType::NumberValue:
			val.SetNumber(m_currentSymbol->numVal);
			break;
		case SymbolType::IntegerValue:
			val.SetInteger(m_currentSymbol->intVal);
			break;
		case SymbolType::BooleanValue:
			val.SetBoolean(m_currentSymbol->boolVal);
			break;
		case SymbolType::StringValue:
			val.SetString(m_currentSymbol->text);
			break;
		case SymbolType::Null:
			break;
		default:
			Error("Unknown value");
		}
		NextSymbol();
		return val;
	}